

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::MarkTempProcessInstr(BackwardPass *this,Instr *instr)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x192d,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pBVar1 = this->currentBlock;
  if ((pBVar1->field_0x18 & 2) == 0) {
    if (this->tag == BackwardPhase) {
      bVar3 = SatisfyMarkTempObjectsConditions(this);
      if (bVar3) {
        ObjectTemp::ProcessInstr(instr);
      }
    }
    if (this->tag == DeadStorePhase) {
      bVar3 = SatisfyMarkTempObjectsConditions(this);
      if (bVar3) {
        ObjectTempVerify::ProcessInstr
                  (&pBVar1->tempObjectVerifyTracker->super_ObjectTempVerify,instr,this);
        return;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::MarkTempProcessInstr(IR::Instr * instr)
{
    Assert(!IsCollectionPass());

    if (this->currentBlock->isDead)
    {
        return;
    }

    BasicBlock * block;
    block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        block->tempNumberTracker->ProcessInstr(instr, this);
    }

    if (this->DoMarkTempObjects())
    {
        block->tempObjectTracker->ProcessInstr(instr);
    }

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        block->tempObjectVerifyTracker->ProcessInstr(instr, this);
    }
#endif
}